

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

CPAccessResult fpexc32_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  int iVar1;
  
  if (((*(byte *)((long)(env->cp15).cptr_el + 0x11) & 4) != 0) &&
     (iVar1 = arm_current_el(env), iVar1 == 2)) {
    return CP_ACCESS_TRAP_FP_EL2;
  }
  return (uint)(env->cp15).cptr_el[3] >> 7 & CP_ACCESS_TRAP_FP_EL3;
}

Assistant:

static CPAccessResult fpexc32_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                     bool isread)
{
    if ((env->cp15.cptr_el[2] & CPTR_TFP) && arm_current_el(env) == 2) {
        return CP_ACCESS_TRAP_FP_EL2;
    }
    if (env->cp15.cptr_el[3] & CPTR_TFP) {
        return CP_ACCESS_TRAP_FP_EL3;
    }
    return CP_ACCESS_OK;
}